

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.c
# Opt level: O3

_Bool Curl_pipeline_penalized(Curl_easy *data,connectdata *conn)

{
  curl_llist_element *pcVar1;
  long lVar2;
  curl_off_t cVar3;
  curl_off_t cVar4;
  char *pcVar5;
  bool bVar6;
  long lVar7;
  
  if (data == (Curl_easy *)0x0) {
    bVar6 = false;
  }
  else {
    cVar3 = Curl_multi_content_length_penalty_size(data->multi);
    cVar4 = Curl_multi_chunk_length_penalty_size(data->multi);
    pcVar1 = (conn->recv_pipe).head;
    if (pcVar1 == (curl_llist_element *)0x0) {
      lVar7 = -2;
      bVar6 = false;
    }
    else {
      lVar7 = *(long *)((long)pcVar1->ptr + 0xc0);
      bVar6 = cVar3 < lVar7 && 0 < cVar3;
    }
    lVar2 = (conn->chunk).datasize;
    if (0 < cVar4) {
      bVar6 = (bool)(cVar4 < lVar2 | bVar6);
    }
    pcVar5 = "FALSE";
    if (bVar6) {
      pcVar5 = "TRUE";
    }
    Curl_infof(data,"Conn: %ld (%p) Receive pipe weight: (%ld/%zu), penalized: %s\n",
               conn->connection_id,conn,lVar7,lVar2,pcVar5);
  }
  return bVar6;
}

Assistant:

bool Curl_pipeline_penalized(struct Curl_easy *data,
                             struct connectdata *conn)
{
  if(data) {
    bool penalized = FALSE;
    curl_off_t penalty_size =
      Curl_multi_content_length_penalty_size(data->multi);
    curl_off_t chunk_penalty_size =
      Curl_multi_chunk_length_penalty_size(data->multi);
    curl_off_t recv_size = -2; /* Make it easy to spot in the log */

    /* Find the head of the recv pipe, if any */
    if(conn->recv_pipe.head) {
      struct Curl_easy *recv_handle = conn->recv_pipe.head->ptr;

      recv_size = recv_handle->req.size;

      if(penalty_size > 0 && recv_size > penalty_size)
        penalized = TRUE;
    }

    if(chunk_penalty_size > 0 &&
       (curl_off_t)conn->chunk.datasize > chunk_penalty_size)
      penalized = TRUE;

    infof(data, "Conn: %ld (%p) Receive pipe weight: (%"
          CURL_FORMAT_CURL_OFF_T "/%zu), penalized: %s\n",
          conn->connection_id, (void *)conn, recv_size,
          conn->chunk.datasize, penalized?"TRUE":"FALSE");
    return penalized;
  }
  return FALSE;
}